

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O1

bool __thiscall
csm::ModelIdentifier::addComponent(ModelIdentifier *this,string *argName,double argValue)

{
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>_>,_bool>
  pVar1;
  MIComponent component;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  local_60;
  Data local_28;
  
  local_28.theType = DOUBLE_TYPE;
  local_28.field_1.theDbl = argValue;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  ::pair<csm::MIC::Data,_true>(&local_60,argName,&local_28);
  MIC::Data::~Data(&local_28);
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,csm::MIC::Data>,std::_Select1st<std::pair<std::__cxx11::string_const,csm::MIC::Data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,csm::MIC::Data>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,csm::MIC::Data>const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,csm::MIC::Data>,std::_Select1st<std::pair<std::__cxx11::string_const,csm::MIC::Data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,csm::MIC::Data>>>
                      *)this,&local_60);
  MIC::Data::~Data(&local_60.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  return (bool)(pVar1.second & 1);
}

Assistant:

bool ModelIdentifier::addComponent(const std::string& argName,
                                   double             argValue)
{
   MIComponent component(argName,MIC::Data(argValue));
   
   return addComponent(component);
}